

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O0

void __thiscall OStreamTest_Join_Test::TestBody(OStreamTest_Join_Test *this)

{
  string_view sep;
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  int v [3];
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  int *begin;
  char *expected_expression;
  size_t in_stack_ffffffffffffff60;
  char *file;
  Type in_stack_ffffffffffffff6c;
  arg_join<int_*,_char> *in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffff78) [3];
  char local_68 [32];
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_28;
  undefined8 local_18;
  undefined4 local_10;
  int local_c [3];
  
  local_18 = 0x200000001;
  local_10 = 3;
  begin = local_c;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  expected_expression = local_68;
  sep.size_ = in_stack_ffffffffffffff60;
  sep.data_ = expected_expression;
  fmt::v5::join<int*>(begin,(int *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),sep
                     );
  file = &stack0xffffffffffffffb8;
  fmt::v5::format<char[3],fmt::v5::arg_join<int*,char>>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            (expected_expression,(char *)begin,
             (char (*) [8])CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x112e62)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,file,
               (int)((ulong)expected_expression >> 0x20),(char *)begin);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x112eb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112ef3);
  return;
}

Assistant:

TEST(OStreamTest, Join) {
  int v[3] = {1, 2, 3};
  EXPECT_EQ("1, 2, 3", fmt::format("{}", fmt::join(v, v + 3, ", ")));
}